

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::add_new_feature(search_private *priv,float val,uint64_t idx)

{
  uint32_t uVar1;
  ostream *poVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  ulong in_RSI;
  long *in_RDI;
  stringstream temp;
  features *fs;
  uint64_t idx2;
  size_t ss;
  uint64_t mask;
  parameters *in_stack_fffffffffffffda8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  feature_index in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  feature_value v;
  features *in_stack_fffffffffffffdc0;
  string local_220 [48];
  string local_1f0 [48];
  stringstream local_1c0 [16];
  ostream local_1b0;
  long local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  long *local_8;
  
  v = (feature_value)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_18 = in_RSI;
  local_8 = in_RDI;
  local_20 = parameters::mask(in_stack_fffffffffffffda8);
  uVar1 = parameters::stride_shift(in_stack_fffffffffffffda8);
  local_28 = (ulong)uVar1;
  local_30 = (local_18 & local_20) >> ((byte)uVar1 & 0x3f) & local_20;
  local_38 = local_8[0x6a] + 0x20 + local_8[0x9c] * 0x68;
  features::push_back(in_stack_fffffffffffffdc0,v,in_stack_fffffffffffffdb0);
  if ((*(byte *)(*local_8 + 0x3438) & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar2 = std::operator<<(&local_1b0,"fid=");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(local_18 & local_20) >> ((byte)local_28 & 0x3f));
    this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::operator<<(poVar2,"_");
    std::__cxx11::stringstream::str();
    std::operator<<((ostream *)this,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    this_00 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_38 + 0x40);
    __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x40);
    __p = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_8[0x9d];
    std::__cxx11::stringstream::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this,__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00
              );
    std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
    shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
              ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,__p);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(this_00,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)__p);
    std::
    shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x39a3c1);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return;
}

Assistant:

void add_new_feature(search_private& priv, float val, uint64_t idx)
{
  uint64_t mask = priv.all->weights.mask();
  size_t ss = priv.all->weights.stride_shift();

  uint64_t idx2 = ((idx & mask) >> ss) & mask;
  features& fs = priv.dat_new_feature_ec->feature_space[priv.dat_new_feature_namespace];
  fs.push_back(val * priv.dat_new_feature_value, ((priv.dat_new_feature_idx + idx2) << ss));
  cdbg << "adding: " << fs.indicies.last() << ':' << fs.values.last() << endl;
  if (priv.all->audit)
  {
    stringstream temp;
    temp << "fid=" << ((idx & mask) >> ss) << "_" << priv.dat_new_feature_audit_ss.str();
    fs.space_names.push_back(audit_strings_ptr(new audit_strings(*priv.dat_new_feature_feature_space, temp.str())));
  }
}